

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sfc::Image::save_scaled(Image *this,string *path,Mode mode)

{
  uint uVar1;
  char *pcVar2;
  runtime_error *this_00;
  allocator<char> local_b1;
  string local_b0;
  uint local_90;
  uint error;
  rgba_vec_t local_80;
  rgba_vec_t local_68;
  rgba_vec_t local_50;
  undefined1 local_38 [8];
  byte_vec_t scaled_data;
  Mode mode_local;
  string *path_local;
  Image *this_local;
  
  scaled_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = mode;
  rgba_data(&local_80,this);
  reduce_colors(&local_68,&local_80,
                scaled_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  normalize_colors(&local_50,&local_68,
                   scaled_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  to_bytes((byte_vec_t *)local_38,&local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (path);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar2,&local_b1);
  uVar1 = lodepng::encode(&local_b0,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                          this->_width,this->_height,LCT_RGBA,8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_90 = uVar1;
  if (uVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar2 = lodepng_error_text(local_90);
    std::runtime_error::runtime_error(this_00,pcVar2);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void Image::save_scaled(const std::string& path, Mode mode) {
  auto scaled_data = to_bytes(normalize_colors(reduce_colors(rgba_data(), mode), mode));
  unsigned error = lodepng::encode(path.c_str(), scaled_data, _width, _height, LCT_RGBA, 8);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));
}